

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationBasicEventTests.cpp
# Opt level: O1

TestStatus *
vkt::synchronization::anon_unknown_0::secondaryCommandBufferCase
          (TestStatus *__return_storage_ptr__,Context *context)

{
  long lVar1;
  long *plVar2;
  deUint32 queueFamilyIndex;
  VkResult VVar3;
  int iVar4;
  DeviceInterface *vk;
  VkDevice device;
  VkQueue pVVar5;
  long lVar6;
  VkCommandBuffer secondaryCmdBuffers [2];
  long *local_1e8;
  long local_1e0;
  long local_1d8 [2];
  Move<vk::VkCommandBuffer_s_*> primaryCmdBuffer;
  VkSubmitInfo submitInfo;
  VkEvent local_148;
  Deleter<vk::Handle<(vk::HandleType)10>_> DStack_140;
  VkCommandPool local_128;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_120;
  VkFence local_108;
  Deleter<vk::Handle<(vk::HandleType)6>_> DStack_100;
  Move<vk::VkCommandBuffer_s_*> prtCmdBuffers [2];
  VkCommandBufferInheritanceInfo local_a8;
  VkCommandBufferBeginInfo cmdBufferBeginInfo;
  VkCommandBufferAllocateInfo cmdBufferInfo;
  
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  pVVar5 = Context::getUniversalQueue(context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&submitInfo,vk,device,0,
                    (VkAllocationCallbacks *)0x0);
  DStack_100.m_device = (VkDevice)submitInfo._16_8_;
  DStack_100.m_allocator = (VkAllocationCallbacks *)submitInfo.pWaitSemaphores;
  local_108.m_internal = submitInfo._0_8_;
  DStack_100.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&submitInfo,vk,device,2,queueFamilyIndex,
             (VkAllocationCallbacks *)0x0);
  DStack_120.m_device = (VkDevice)submitInfo._16_8_;
  DStack_120.m_allocator = (VkAllocationCallbacks *)submitInfo.pWaitSemaphores;
  local_128.m_internal = submitInfo._0_8_;
  DStack_120.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  makeCommandBuffer(&primaryCmdBuffer,vk,device,(VkCommandPool)submitInfo._0_8_);
  cmdBufferInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
  cmdBufferInfo.pNext = (void *)0x0;
  cmdBufferInfo.commandPool.m_internal = local_128.m_internal;
  cmdBufferInfo.level = VK_COMMAND_BUFFER_LEVEL_SECONDARY;
  cmdBufferInfo.commandBufferCount = 1;
  ::vk::allocateCommandBuffer(prtCmdBuffers,vk,device,&cmdBufferInfo);
  ::vk::allocateCommandBuffer(prtCmdBuffers + 1,vk,device,&cmdBufferInfo);
  secondaryCmdBuffers[0] = prtCmdBuffers[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
  secondaryCmdBuffers[1] = prtCmdBuffers[1].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)&primaryCmdBuffer;
  ::vk::createEvent((Move<vk::Handle<(vk::HandleType)10>_> *)&local_a8,vk,device,0,
                    (VkAllocationCallbacks *)0x0);
  local_148.m_internal = CONCAT44(local_a8._4_4_,local_a8.sType);
  DStack_140.m_device._0_4_ = (undefined4)local_a8.renderPass.m_internal;
  DStack_140.m_device._4_4_ = local_a8.renderPass.m_internal._4_4_;
  DStack_140.m_allocator._0_4_ = local_a8.subpass;
  DStack_140.m_allocator._4_4_ = local_a8._28_4_;
  DStack_140.m_deviceIface = (DeviceInterface *)local_a8.pNext;
  local_a8.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_INHERITANCE_INFO;
  local_a8.pNext = (void *)0x0;
  local_a8.renderPass.m_internal = 0;
  local_a8.subpass = 0;
  local_a8.framebuffer.m_internal = 0;
  local_a8.occlusionQueryEnable = 0;
  local_a8.queryFlags = 0;
  local_a8.pipelineStatistics = 0;
  cmdBufferBeginInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  cmdBufferBeginInfo.pNext = (void *)0x0;
  cmdBufferBeginInfo.flags = 1;
  cmdBufferBeginInfo.pInheritanceInfo = &local_a8;
  VVar3 = (*vk->_vptr_DeviceInterface[0x49])(vk,secondaryCmdBuffers[0]);
  ::vk::checkResult(VVar3,"vk.beginCommandBuffer(secondaryCmdBuffers[SET], &cmdBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicEventTests.cpp"
                    ,0x144);
  (*vk->_vptr_DeviceInterface[0x6a])(vk,secondaryCmdBuffers[0],local_148.m_internal,1);
  endCommandBuffer(vk,secondaryCmdBuffers[0]);
  VVar3 = (*vk->_vptr_DeviceInterface[0x49])(vk,secondaryCmdBuffers[1],&cmdBufferBeginInfo);
  ::vk::checkResult(VVar3,"vk.beginCommandBuffer(secondaryCmdBuffers[WAIT], &cmdBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicEventTests.cpp"
                    ,0x148);
  (*vk->_vptr_DeviceInterface[0x6c])(vk,secondaryCmdBuffers[1],1,&local_148,1,0x10000,0,0,0,0,0,0);
  endCommandBuffer(vk,secondaryCmdBuffers[1]);
  beginCommandBuffer(vk,primaryCmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  (*vk->_vptr_DeviceInterface[0x77])
            (vk,primaryCmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,2,
             secondaryCmdBuffers);
  endCommandBuffer(vk,primaryCmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  VVar3 = (*vk->_vptr_DeviceInterface[2])(vk,pVVar5,1,&submitInfo,local_108.m_internal);
  ::vk::checkResult(VVar3,"vk.queueSubmit(queue, 1u, &submitInfo, *fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicEventTests.cpp"
                    ,0x150);
  iVar4 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,1,&local_108,1,0xffffffffffffffff);
  local_1e8 = local_1d8;
  if (iVar4 == 0) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1e8,
               "Wait and set even on device using secondary command buffers tests pass","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_1e8,
               local_1e0 + (long)local_1e8);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1e8,"Queue should end execution","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_1e8,
               local_1e0 + (long)local_1e8);
  }
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8,local_1d8[0] + 1);
  }
  if (local_148.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)10>_>::operator()(&DStack_140,local_148);
  }
  lVar6 = 0x20;
  do {
    lVar1 = *(long *)((long)&prtCmdBuffers[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object +
                     lVar6);
    if (lVar1 != 0) {
      plVar2 = *(long **)((long)&prtCmdBuffers[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
                                 deleter.m_deviceIface + lVar6);
      submitInfo._0_8_ = lVar1;
      (**(code **)(*plVar2 + 0x240))
                (plVar2,*(undefined8 *)
                         ((long)&prtCmdBuffers[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
                                 deleter.m_device + lVar6),
                 *(undefined8 *)
                  ((long)&prtCmdBuffers[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                          m_pool.m_internal + lVar6),1,&submitInfo);
    }
    *(undefined8 *)
     ((long)&prtCmdBuffers[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device + lVar6
     ) = 0;
    *(undefined8 *)
     ((long)&prtCmdBuffers[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.
             m_internal + lVar6) = 0;
    *(undefined8 *)
     ((long)&prtCmdBuffers[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object + lVar6) = 0;
    *(undefined8 *)
     ((long)&prtCmdBuffers[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface +
     lVar6) = 0;
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x20);
  if (primaryCmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object !=
      (VkCommandBuffer_s *)0x0) {
    submitInfo._0_8_ = primaryCmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
    (*(primaryCmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface)->
      _vptr_DeviceInterface[0x48])
              (primaryCmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface,
               primaryCmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device,
               primaryCmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.
               m_internal,1);
  }
  if (local_128.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_120,local_128);
  }
  if (local_108.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()(&DStack_100,local_108);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus secondaryCommandBufferCase (Context& context)
{
	enum {SET=0, WAIT, COUNT};
	const DeviceInterface&					vk						= context.getDeviceInterface();
	const VkDevice							device					= context.getDevice();
	const VkQueue							queue					= context.getUniversalQueue();
	const deUint32							queueFamilyIndex		= context.getUniversalQueueFamilyIndex();
	const Unique<VkFence>					fence					(createFence(vk, device));
	const Unique<VkCommandPool>				cmdPool					(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Move<VkCommandBuffer>				primaryCmdBuffer		(makeCommandBuffer(vk, device, *cmdPool));
	const VkCommandBufferAllocateInfo		cmdBufferInfo			=
																	{
																		VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO,		// VkStructureType		sType;
																		DE_NULL,											// const void*			pNext;
																		*cmdPool,											// VkCommandPool		commandPool;
																		VK_COMMAND_BUFFER_LEVEL_SECONDARY,					// VkCommandBufferLevel	level;
																		1u,													// deUint32				commandBufferCount;
																	};
	const Move<VkCommandBuffer>				prtCmdBuffers[COUNT]	= {allocateCommandBuffer (vk, device, &cmdBufferInfo), allocateCommandBuffer (vk, device, &cmdBufferInfo)};
	VkCommandBuffer							secondaryCmdBuffers[]	= {*prtCmdBuffers[SET], *prtCmdBuffers[WAIT]};
	const VkSubmitInfo						submitInfo				=
																	{
																		VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType				sType;
																		DE_NULL,						// const void*					pNext;
																		0u,								// deUint32						waitSemaphoreCount;
																		DE_NULL,						// const VkSemaphore*			pWaitSemaphores;
																		DE_NULL,						// const VkPipelineStageFlags*	pWaitDstStageMask;
																		1u,								// deUint32						commandBufferCount;
																		&primaryCmdBuffer.get(),		// const VkCommandBuffer*		pCommandBuffers;
																		0u,								// deUint32						signalSemaphoreCount;
																		DE_NULL,						// const VkSemaphore*			pSignalSemaphores;
																	};
	const Unique<VkEvent>					event					(createEvent(vk, device));

	const VkCommandBufferInheritanceInfo	secCmdBufInheritInfo	=
																	{
																		VK_STRUCTURE_TYPE_COMMAND_BUFFER_INHERITANCE_INFO,	//VkStructureType					sType;
																		DE_NULL,											//const void*						pNext;
																		DE_NULL,											//VkRenderPass					renderPass;
																		0u,													//deUint32						subpass;
																		DE_NULL,											//VkFramebuffer					framebuffer;
																		VK_FALSE,											//VkBool32						occlusionQueryEnable;
																		(VkQueryControlFlags)0u,							//VkQueryControlFlags				queryFlags;
																		(VkQueryPipelineStatisticFlags)0u,					//VkQueryPipelineStatisticFlags	pipelineStatistics;
																	};
	const VkCommandBufferBeginInfo			cmdBufferBeginInfo		=
																	{
																		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,	// VkStructureType                          sType;
																		DE_NULL,										// const void*                              pNext;
																		VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT,	// VkCommandBufferUsageFlags                flags;
																		&secCmdBufInheritInfo,							// const VkCommandBufferInheritanceInfo*    pInheritanceInfo;
																	};

	VK_CHECK(vk.beginCommandBuffer(secondaryCmdBuffers[SET], &cmdBufferBeginInfo));
	vk.cmdSetEvent(secondaryCmdBuffers[SET], *event, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT);
	endCommandBuffer(vk, secondaryCmdBuffers[SET]);

	VK_CHECK(vk.beginCommandBuffer(secondaryCmdBuffers[WAIT], &cmdBufferBeginInfo));
	vk.cmdWaitEvents(secondaryCmdBuffers[WAIT], 1u, &event.get(),VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_ALL_COMMANDS_BIT, 0u, DE_NULL, 0u, DE_NULL, 0u, DE_NULL);
	endCommandBuffer(vk, secondaryCmdBuffers[WAIT]);

	beginCommandBuffer(vk, *primaryCmdBuffer);
	vk.cmdExecuteCommands(*primaryCmdBuffer, 2u, secondaryCmdBuffers);
	endCommandBuffer(vk, *primaryCmdBuffer);

	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, *fence));
	if (VK_SUCCESS != vk.waitForFences(device, 1u, &fence.get(), DE_TRUE, LONG_FENCE_WAIT))
		return tcu::TestStatus::fail("Queue should end execution");

	return tcu::TestStatus::pass("Wait and set even on device using secondary command buffers tests pass");
}